

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtracer-inl.h
# Opt level: O0

void __thiscall
spdlog::details::backtracer::foreach_pop
          (backtracer *this,function<void_(const_spdlog::details::log_msg_&)> *fun)

{
  bool bVar1;
  log_msg_buffer *this_00;
  long in_RDI;
  log_msg_buffer *front_msg;
  lock_guard<std::mutex> lock;
  log_msg *in_stack_ffffffffffffffa8;
  lock_guard<std::mutex> *in_stack_ffffffffffffffb0;
  
  std::lock_guard<std::mutex>::lock_guard
            (in_stack_ffffffffffffffb0,(mutex_type *)in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = circular_q<spdlog::details::log_msg_buffer>::empty
                      ((circular_q<spdlog::details::log_msg_buffer> *)(in_RDI + 0x30));
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    this_00 = circular_q<spdlog::details::log_msg_buffer>::front
                        ((circular_q<spdlog::details::log_msg_buffer> *)0x1a2485);
    std::function<void_(const_spdlog::details::log_msg_&)>::operator()
              ((function<void_(const_spdlog::details::log_msg_&)> *)this_00,
               in_stack_ffffffffffffffa8);
    circular_q<spdlog::details::log_msg_buffer>::pop_front
              ((circular_q<spdlog::details::log_msg_buffer> *)(in_RDI + 0x30));
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1a24dd);
  return;
}

Assistant:

SPDLOG_INLINE void backtracer::foreach_pop(std::function<void(const details::log_msg &)> fun)
{
    std::lock_guard<std::mutex> lock{mutex_};
    while (!messages_.empty())
    {
        auto &front_msg = messages_.front();
        fun(front_msg);
        messages_.pop_front();
    }
}